

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

size_t __thiscall CLI::App::_count_remaining_positionals(App *this,bool required_only)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  pointer pOVar3;
  size_t sVar4;
  Option_p *opt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2;
  size_t retval;
  bool required_only_local;
  App *this_local;
  
  __range2 = (vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              *)0x0;
  __end2 = std::
           vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ::begin(&this->options_);
  opt = (Option_p *)
        std::
        vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ::end(&this->options_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                *)&opt);
    if (!bVar1) {
      return (size_t)__range2;
    }
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
              ::operator*(&__end2);
    pOVar3 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(this_00);
    bVar1 = Option::get_positional(pOVar3);
    if (bVar1) {
      if (required_only) {
        pOVar3 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (this_00);
        bVar1 = OptionBase<CLI::Option>::get_required(&pOVar3->super_OptionBase<CLI::Option>);
        if (!bVar1) goto LAB_001918e1;
      }
      pOVar3 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(this_00);
      iVar2 = Option::get_items_expected_min(pOVar3);
      if (0 < iVar2) {
        pOVar3 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (this_00);
        sVar4 = Option::count(pOVar3);
        pOVar3 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (this_00);
        iVar2 = Option::get_items_expected_min(pOVar3);
        if ((int)sVar4 < iVar2) {
          pOVar3 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (this_00);
          iVar2 = Option::get_items_expected_min(pOVar3);
          pOVar3 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (this_00);
          sVar4 = Option::count(pOVar3);
          __range2 = (vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                      *)(((long)iVar2 - sVar4) + (long)__range2);
        }
      }
    }
LAB_001918e1:
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

std::size_t _count_remaining_positionals(bool required_only = false) const {
        std::size_t retval = 0;
        for(const Option_p &opt : options_) {
            if(opt->get_positional() && (!required_only || opt->get_required())) {
                if(opt->get_items_expected_min() > 0 &&
                   static_cast<int>(opt->count()) < opt->get_items_expected_min()) {
                    retval += static_cast<std::size_t>(opt->get_items_expected_min()) - opt->count();
                }
            }
        }
        return retval;
    }